

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmLink<(moira::Instr)68,(moira::Mode)12,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  StrWriter *pSVar2;
  Av<(moira::Instr)68,_(moira::Mode)12,_2> local_58;
  Ims<2> local_54 [2];
  int local_4c;
  int local_48;
  Ims<2> local_40 [2];
  int local_38;
  int local_34;
  An local_2c;
  u32 local_28;
  An src;
  u32 dsp;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  src.raw._2_2_ = op;
  local_28 = dasmIncRead<2>(this,addr);
  An::An(&local_2c,src.raw._2_2_ & 7);
  SVar1 = str->style->syntax;
  if (SVar1 == GNU || SVar1 == GNU_MIT) {
    pSVar2 = StrWriter::operator<<(str);
    pSVar2 = StrWriter::operator<<(pSVar2);
    local_34 = (str->tab).raw;
    pSVar2 = StrWriter::operator<<(pSVar2,(Tab)local_34);
    local_38 = local_2c.raw;
    pSVar2 = StrWriter::operator<<(pSVar2,local_2c);
    pSVar2 = StrWriter::operator<<(pSVar2);
    Ims<2>::Ims(local_40,local_28);
    StrWriter::operator<<(pSVar2,local_40[0]);
  }
  else {
    pSVar2 = StrWriter::operator<<(str);
    local_48 = (str->tab).raw;
    pSVar2 = StrWriter::operator<<(pSVar2,(Tab)local_48);
    local_4c = local_2c.raw;
    pSVar2 = StrWriter::operator<<(pSVar2,local_2c);
    pSVar2 = StrWriter::operator<<(pSVar2);
    Ims<2>::Ims(local_54,local_28);
    pSVar2 = StrWriter::operator<<(pSVar2,local_54[0]);
    local_58.ext1 = 0;
    StrWriter::operator<<(pSVar2,&local_58);
  }
  return;
}

Assistant:

void
Moira::dasmLink(StrWriter &str, u32 &addr, u16 op) const
{
    auto dsp = dasmIncRead<S>(addr);
    auto src = An ( _____________xxx(op) );

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << Ims<S>(dsp);
            break;

        default:

            str << Ins<I>{} << str.tab << src << Sep{} << Ims<S>(dsp) << Av<I, M, S>{};
    }
}